

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# listener_buffer.c
# Opt level: O2

HT_ErrorCode ht_listener_buffer_init(HT_ListenerBuffer *buffer,size_t max_size)

{
  HT_Byte *pHVar1;
  
  if (max_size == 0) {
    buffer->data = (HT_Byte *)0x0;
  }
  else {
    pHVar1 = (HT_Byte *)ht_alloc(max_size);
    buffer->data = pHVar1;
    if (pHVar1 == (HT_Byte *)0x0) {
      return HT_ERR_OUT_OF_MEMORY;
    }
  }
  buffer->max_size = max_size;
  buffer->usage = 0;
  return HT_ERR_OK;
}

Assistant:

HT_ErrorCode
ht_listener_buffer_init(HT_ListenerBuffer* buffer, size_t max_size)
{
    if (max_size == 0)
    {
        buffer->data = NULL;
    }
    else
    {
        buffer->data = (HT_Byte*)ht_alloc(max_size);

        if (buffer->data == NULL)
        {
            return HT_ERR_OUT_OF_MEMORY;
        }
    }

    buffer->max_size = max_size;
    buffer->usage = 0;

    return HT_ERR_OK;
}